

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_dictionary.hpp
# Opt level: O0

bool pd::prepareDataPhrasesFromWordvec
               (string *dir_name,string *data_filename,
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
               *words_dict)

{
  bool bVar1;
  byte bVar2;
  type this;
  string *psVar3;
  ostream *poVar4;
  istream *piVar5;
  size_type sVar6;
  pointer pvVar7;
  iterator iVar8;
  iterator iVar9;
  const_iterator cVar10;
  iterator iVar11;
  reference pdVar12;
  basic_ostream<char,_std::char_traits<char>_> *this_00;
  byte local_61a;
  byte local_5b4;
  path local_5a8;
  double local_588;
  double elem;
  iterator __end8;
  iterator __begin8;
  vector<double,_std::allocator<double>_> *__range8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>,_true>
  local_538;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>,_true>
  local_530;
  const_iterator it_1;
  vector<double,_std::allocator<double>_> result;
  string line;
  long local_4e8;
  ifstream fi;
  path local_2e0;
  path *local_2c0;
  path *p;
  bool _foreach_continue150;
  auto_any_base *local_2a8;
  auto_any_t _foreach_end150;
  auto_any_base *local_298;
  auto_any_t _foreach_cur150;
  pair<boost::filesystem::directory_iterator,_boost::filesystem::directory_iterator> local_280;
  pair<boost::filesystem::directory_iterator,_boost::filesystem::directory_iterator> *local_270;
  auto_any_t _foreach_col150;
  ofstream of;
  directory_iterator local_68;
  directory_iterator eod;
  directory_iterator local_50;
  directory_iterator it;
  path targetDir;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
  *words_dict_local;
  string *data_filename_local;
  string *dir_name_local;
  
  boost::filesystem::path::path((path *)&it,dir_name);
  boost::filesystem::directory_iterator::directory_iterator(&local_50,(path *)&it,none);
  boost::filesystem::directory_iterator::directory_iterator(&local_68);
  std::ofstream::ofstream(&_foreach_col150,(string *)data_filename,_S_out);
  std::make_pair<boost::filesystem::directory_iterator&,boost::filesystem::directory_iterator&>
            ((directory_iterator *)&_foreach_cur150,&local_50);
  boost::foreach_detail_::
  contain<std::pair<boost::filesystem::directory_iterator,boost::filesystem::directory_iterator>>
            (&local_280,(true_ *)&_foreach_cur150);
  std::pair<boost::filesystem::directory_iterator,_boost::filesystem::directory_iterator>::~pair
            ((pair<boost::filesystem::directory_iterator,_boost::filesystem::directory_iterator> *)
             &_foreach_cur150);
  local_270 = &local_280;
  bVar1 = boost::foreach_detail_::auto_any_base::operator_cast_to_bool((auto_any_base *)local_270);
  if (!bVar1) {
    boost::foreach_detail_::
    begin<std::pair<boost::filesystem::directory_iterator,boost::filesystem::directory_iterator>,mpl_::bool_<true>>
              ((foreach_detail_ *)&_foreach_end150,(auto_any_t)local_270,
               (type2type<std::pair<boost::filesystem::directory_iterator,_boost::filesystem::directory_iterator>,_mpl_::bool_<true>_>
                *)0x0,(true_ *)0x0);
    local_298 = (auto_any_base *)&_foreach_end150;
    bVar1 = boost::foreach_detail_::auto_any_base::operator_cast_to_bool(local_298);
    if (bVar1) {
LAB_0013ade5:
      bVar1 = false;
    }
    else {
      boost::foreach_detail_::
      end<std::pair<boost::filesystem::directory_iterator,boost::filesystem::directory_iterator>,mpl_::bool_<true>>
                ((foreach_detail_ *)&stack0xfffffffffffffd50,(auto_any_t)local_270,
                 (type2type<std::pair<boost::filesystem::directory_iterator,_boost::filesystem::directory_iterator>,_mpl_::bool_<true>_>
                  *)0x0,(true_ *)0x0);
      local_2a8 = (auto_any_base *)&stack0xfffffffffffffd50;
      bVar1 = boost::foreach_detail_::auto_any_base::operator_cast_to_bool(local_2a8);
      if (!bVar1) {
        p._7_1_ = 1;
        while( true ) {
          local_5b4 = 0;
          if ((p._7_1_ & 1) != 0) {
            bVar1 = boost::foreach_detail_::
                    done<std::pair<boost::filesystem::directory_iterator,boost::filesystem::directory_iterator>,mpl_::bool_<true>>
                              (local_298,local_2a8,
                               (type2type<std::pair<boost::filesystem::directory_iterator,_boost::filesystem::directory_iterator>,_mpl_::bool_<true>_>
                                *)0x0);
            local_5b4 = bVar1 ^ 0xff;
          }
          if ((local_5b4 & 1) == 0) break;
          bVar1 = boost::foreach_detail_::set_false((bool *)((long)&p + 7));
          if (!bVar1) {
            this = boost::foreach_detail_::
                   deref<std::pair<boost::filesystem::directory_iterator,boost::filesystem::directory_iterator>,mpl_::bool_<true>>
                             (local_298,
                              (type2type<std::pair<boost::filesystem::directory_iterator,_boost::filesystem::directory_iterator>,_mpl_::bool_<true>_>
                               *)0x0);
            local_2c0 = boost::filesystem::directory_entry::operator_cast_to_path_(this);
            while (((p._7_1_ ^ 0xff) & 1) != 0) {
              bVar1 = boost::filesystem::is_regular_file(local_2c0);
              if (bVar1) {
                psVar3 = boost::filesystem::path::string_abi_cxx11_(local_2c0);
                poVar4 = std::operator<<((ostream *)&std::cout,(string *)psVar3);
                std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
                boost::filesystem::path::extension();
                bVar1 = boost::filesystem::operator==(&local_2e0,"swp");
                boost::filesystem::path::~path(&local_2e0);
                if (!bVar1) {
                  psVar3 = boost::filesystem::path::string_abi_cxx11_(local_2c0);
                  std::ifstream::ifstream(&local_4e8,(string *)psVar3,_S_in);
                  bVar2 = std::ios::operator!((ios *)((long)&local_4e8 +
                                                     *(long *)(local_4e8 + -0x18)));
                  if ((bVar2 & 1) == 0) {
                    std::__cxx11::string::string
                              ((string *)
                               &result.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage);
                    std::vector<double,_std::allocator<double>_>::vector
                              ((vector<double,_std::allocator<double>_> *)&it_1);
                    while( true ) {
                      piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                         ((istream *)&local_4e8,
                                          (string *)
                                          &result.
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data._M_end_of_storage);
                      bVar1 = std::ios::operator_cast_to_bool
                                        ((ios *)(piVar5 + *(long *)(*(long *)piVar5 + -0x18)));
                      local_61a = 0;
                      if (bVar1) {
                        local_61a = std::__cxx11::string::empty();
                        local_61a = local_61a ^ 0xff;
                      }
                      if ((local_61a & 1) == 0) break;
                      local_530._M_cur =
                           (__node_type *)
                           std::
                           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
                           ::find(words_dict,
                                  (key_type *)
                                  &result.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage);
                      local_538._M_cur =
                           (__node_type *)
                           std::
                           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
                           ::end(words_dict);
                      bVar1 = std::__detail::operator==(&local_530,&local_538);
                      if (bVar1) {
                        poVar4 = std::operator<<((ostream *)&std::cerr,"word ");
                        poVar4 = std::operator<<(poVar4,(string *)
                                                        &result.
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                );
                        poVar4 = std::operator<<(poVar4," in file ");
                        psVar3 = boost::filesystem::path::string_abi_cxx11_(local_2c0);
                        poVar4 = std::operator<<(poVar4,(string *)psVar3);
                        poVar4 = std::operator<<(poVar4," isn\'t found in dictionary");
                        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
                      }
                      else {
                        sVar6 = std::vector<double,_std::allocator<double>_>::size
                                          ((vector<double,_std::allocator<double>_> *)&it_1);
                        if (sVar6 == 0) {
                          pvVar7 = std::__detail::
                                   _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>,_false,_true>
                                   ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>,_false,_true>
                                                 *)&local_530);
                          std::vector<double,_std::allocator<double>_>::operator=
                                    ((vector<double,_std::allocator<double>_> *)&it_1,
                                     &pvVar7->second);
                        }
                        else {
                          iVar8 = std::vector<double,_std::allocator<double>_>::begin
                                            ((vector<double,_std::allocator<double>_> *)&it_1);
                          iVar9 = std::vector<double,_std::allocator<double>_>::end
                                            ((vector<double,_std::allocator<double>_> *)&it_1);
                          pvVar7 = std::__detail::
                                   _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>,_false,_true>
                                   ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>,_false,_true>
                                                 *)&local_530);
                          cVar10 = std::vector<double,_std::allocator<double>_>::begin
                                             (&pvVar7->second);
                          iVar11 = std::vector<double,_std::allocator<double>_>::begin
                                             ((vector<double,_std::allocator<double>_> *)&it_1);
                          std::
                          transform<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::plus<double>>
                                    (iVar8._M_current,iVar9._M_current,cVar10._M_current,
                                     iVar11._M_current);
                        }
                      }
                    }
                    __end8 = std::vector<double,_std::allocator<double>_>::begin
                                       ((vector<double,_std::allocator<double>_> *)&it_1);
                    elem = (double)std::vector<double,_std::allocator<double>_>::end
                                             ((vector<double,_std::allocator<double>_> *)&it_1);
                    while (bVar1 = __gnu_cxx::operator!=
                                             (&__end8,(
                                                  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                                  *)&elem), bVar1) {
                      pdVar12 = __gnu_cxx::
                                __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                ::operator*(&__end8);
                      local_588 = *pdVar12;
                      poVar4 = (ostream *)
                               std::ostream::operator<<((ostream *)&_foreach_col150,local_588);
                      std::operator<<(poVar4,",");
                      __gnu_cxx::
                      __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                      operator++(&__end8);
                    }
                    boost::filesystem::path::filename();
                    this_00 = boost::filesystem::operator<<
                                        ((basic_ostream<char,_std::char_traits<char>_> *)
                                         &_foreach_col150,&local_5a8);
                    std::ostream::operator<<
                              ((ostream *)this_00,std::endl<char,std::char_traits<char>>);
                    boost::filesystem::path::~path(&local_5a8);
                    std::vector<double,_std::allocator<double>_>::~vector
                              ((vector<double,_std::allocator<double>_> *)&it_1);
                    std::__cxx11::string::~string
                              ((string *)
                               &result.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage);
                    bVar1 = false;
                  }
                  else {
                    poVar4 = std::operator<<((ostream *)&std::cerr,"File ");
                    psVar3 = boost::filesystem::path::string_abi_cxx11_(local_2c0);
                    poVar4 = std::operator<<(poVar4,(string *)psVar3);
                    poVar4 = std::operator<<(poVar4,"doesn\'t exist");
                    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
                    dir_name_local._7_1_ = 0;
                    bVar1 = true;
                  }
                  std::ifstream::~ifstream(&local_4e8);
                  if (bVar1) goto LAB_0013adbd;
                }
              }
              p._7_1_ = 1;
            }
          }
          if ((p._7_1_ & 1) != 0) {
            boost::foreach_detail_::
            next<std::pair<boost::filesystem::directory_iterator,boost::filesystem::directory_iterator>,mpl_::bool_<true>>
                      (local_298,
                       (type2type<std::pair<boost::filesystem::directory_iterator,_boost::filesystem::directory_iterator>,_mpl_::bool_<true>_>
                        *)0x0);
          }
        }
      }
      bVar1 = false;
LAB_0013adbd:
      boost::foreach_detail_::auto_any<boost::filesystem::directory_iterator>::~auto_any
                ((auto_any<boost::filesystem::directory_iterator> *)&stack0xfffffffffffffd50);
      if (!bVar1) goto LAB_0013ade5;
    }
    boost::foreach_detail_::auto_any<boost::filesystem::directory_iterator>::~auto_any
              ((auto_any<boost::filesystem::directory_iterator> *)&_foreach_end150);
    if (bVar1) goto LAB_0013ae21;
  }
  bVar1 = false;
LAB_0013ae21:
  boost::foreach_detail_::
  auto_any<std::pair<boost::filesystem::directory_iterator,_boost::filesystem::directory_iterator>_>
  ::~auto_any((auto_any<std::pair<boost::filesystem::directory_iterator,_boost::filesystem::directory_iterator>_>
               *)&local_280);
  if (!bVar1) {
    dir_name_local._7_1_ = 1;
  }
  std::ofstream::~ofstream(&_foreach_col150);
  boost::filesystem::directory_iterator::~directory_iterator(&local_68);
  boost::filesystem::directory_iterator::~directory_iterator(&local_50);
  boost::filesystem::path::~path((path *)&it);
  return (bool)(dir_name_local._7_1_ & 1);
}

Assistant:

bool prepareDataPhrasesFromWordvec(const std::string& dir_name, const std::string& data_filename, const std::unordered_map<std::string, std::vector<double>>& words_dict)
    {        
        fs::path targetDir(dir_name); 
        fs::directory_iterator it(targetDir), eod;

        std::ofstream of(data_filename);
        BOOST_FOREACH(const fs::path &p, std::make_pair(it, eod))   
        { 
            if(is_regular_file(p))
            {
                std::cout << p.string() << std::endl;
                if (p.extension() == "swp")
                    continue;
                std::ifstream fi(p.string());
                if (not fi)
                {
                    std::cerr << "File " << p.string() << "doesn't exist" << std::endl;
                    return false;
                }

                std::string line;
                std::vector<double> result;
                while (std::getline(fi, line) and !line.empty())
                {
                    const std::unordered_map<std::string, std::vector<double>>::const_iterator it = words_dict.find(line);
                    if (it == words_dict.end())
                    {
                        std::cerr << "word " << line << " in file " << p.string() << " isn't found in dictionary" << std::endl;
                        //return false;
                        continue;
                    }
                    
                    if (result.size() == 0)
                        result = it->second;
                    else
                        std::transform (result.begin(), result.end(), it->second.begin(), result.begin(), std::plus<double>());                            
                }
                
                for (const double elem: result)
                    of << elem << ",";
                of << p.filename() << std::endl;
            } 
        }
        return true;
    }